

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageStatement
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  int iVar2;
  DescriptorProto *message_00;
  EnumDescriptorProto *enum_type;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions;
  MessageOptions *options;
  OneofDescriptorProto *oneof_decl;
  FieldDescriptorProto *field;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar3;
  undefined1 local_b8 [8];
  LocationRecorder location_5;
  LocationRecorder oneof_location;
  undefined1 local_90 [4];
  int oneof_index;
  LocationRecorder location_4;
  LocationRecorder location_3;
  LocationRecorder location_2;
  LocationRecorder location_1;
  undefined1 local_40 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  location.location_ = (Location *)containing_file;
  bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = LookingAt(this,"message");
    if (bVar1) {
      iVar2 = DescriptorProto::nested_type_size(message);
      LocationRecorder::LocationRecorder((LocationRecorder *)local_40,message_location,3,iVar2);
      message_00 = DescriptorProto::add_nested_type(message);
      this_local._7_1_ =
           ParseMessageDefinition
                     (this,message_00,(LocationRecorder *)local_40,
                      (FileDescriptorProto *)location.location_);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_40);
    }
    else {
      bVar1 = LookingAt(this,"enum");
      if (bVar1) {
        iVar2 = DescriptorProto::enum_type_size(message);
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)&location_2.location_,message_location,4,iVar2);
        enum_type = DescriptorProto::add_enum_type(message);
        this_local._7_1_ =
             ParseEnumDefinition(this,enum_type,(LocationRecorder *)&location_2.location_,
                                 (FileDescriptorProto *)location.location_);
        LocationRecorder::~LocationRecorder((LocationRecorder *)&location_2.location_);
      }
      else {
        bVar1 = LookingAt(this,"extensions");
        if (bVar1) {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)&location_3.location_,message_location,5);
          this_local._7_1_ =
               ParseExtensions(this,message,(LocationRecorder *)&location_3.location_,
                               (FileDescriptorProto *)location.location_);
          LocationRecorder::~LocationRecorder((LocationRecorder *)&location_3.location_);
        }
        else {
          bVar1 = LookingAt(this,"reserved");
          if (bVar1) {
            this_local._7_1_ = ParseReserved(this,message,message_location);
          }
          else {
            bVar1 = LookingAt(this,"extend");
            if (bVar1) {
              LocationRecorder::LocationRecorder
                        ((LocationRecorder *)&location_4.location_,message_location,6);
              extensions = DescriptorProto::mutable_extension(message);
              pRVar3 = DescriptorProto::mutable_nested_type(message);
              this_local._7_1_ =
                   ParseExtend(this,extensions,pRVar3,message_location,3,
                               (LocationRecorder *)&location_4.location_,
                               (FileDescriptorProto *)location.location_);
              LocationRecorder::~LocationRecorder((LocationRecorder *)&location_4.location_);
            }
            else {
              bVar1 = LookingAt(this,"option");
              if (bVar1) {
                LocationRecorder::LocationRecorder((LocationRecorder *)local_90,message_location,7);
                options = DescriptorProto::mutable_options(message);
                this_local._7_1_ =
                     ParseOption(this,&options->super_Message,(LocationRecorder *)local_90,
                                 (FileDescriptorProto *)location.location_,OPTION_STATEMENT);
                LocationRecorder::~LocationRecorder((LocationRecorder *)local_90);
              }
              else {
                bVar1 = LookingAt(this,"oneof");
                if (bVar1) {
                  iVar2 = DescriptorProto::oneof_decl_size(message);
                  LocationRecorder::LocationRecorder
                            ((LocationRecorder *)&location_5.location_,message_location,8,iVar2);
                  oneof_decl = DescriptorProto::add_oneof_decl(message);
                  this_local._7_1_ =
                       ParseOneof(this,oneof_decl,message,iVar2,
                                  (LocationRecorder *)&location_5.location_,message_location,
                                  (FileDescriptorProto *)location.location_);
                  LocationRecorder::~LocationRecorder((LocationRecorder *)&location_5.location_);
                }
                else {
                  iVar2 = DescriptorProto::field_size(message);
                  LocationRecorder::LocationRecorder
                            ((LocationRecorder *)local_b8,message_location,2,iVar2);
                  field = DescriptorProto::add_field(message);
                  pRVar3 = DescriptorProto::mutable_nested_type(message);
                  this_local._7_1_ =
                       ParseMessageField(this,field,pRVar3,message_location,3,
                                         (LocationRecorder *)local_b8,
                                         (FileDescriptorProto *)location.location_);
                  LocationRecorder::~LocationRecorder((LocationRecorder *)local_b8);
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseMessageStatement(DescriptorProto* message,
                                   const LocationRecorder& message_location,
                                   const FileDescriptorProto* containing_file) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kNestedTypeFieldNumber,
                              message->nested_type_size());
    return ParseMessageDefinition(message->add_nested_type(), location,
                                  containing_file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kEnumTypeFieldNumber,
                              message->enum_type_size());
    return ParseEnumDefinition(message->add_enum_type(), location,
                               containing_file);
  } else if (LookingAt("extensions")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionRangeFieldNumber);
    return ParseExtensions(message, location, containing_file);
  } else if (LookingAt("reserved")) {
    return ParseReserved(message, message_location);
  } else if (LookingAt("extend")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kExtensionFieldNumber);
    return ParseExtend(message->mutable_extension(),
                       message->mutable_nested_type(),
                       message_location,
                       DescriptorProto::kNestedTypeFieldNumber,
                       location, containing_file);
  } else if (LookingAt("option")) {
    LocationRecorder location(message_location,
                              DescriptorProto::kOptionsFieldNumber);
    return ParseOption(message->mutable_options(), location,
                       containing_file, OPTION_STATEMENT);
  } else if (LookingAt("oneof")) {
    int oneof_index = message->oneof_decl_size();
    LocationRecorder oneof_location(message_location,
                                    DescriptorProto::kOneofDeclFieldNumber,
                                    oneof_index);

    return ParseOneof(message->add_oneof_decl(), message,
                      oneof_index, oneof_location, message_location,
                      containing_file);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kFieldFieldNumber,
                              message->field_size());
    return ParseMessageField(message->add_field(),
                             message->mutable_nested_type(),
                             message_location,
                             DescriptorProto::kNestedTypeFieldNumber,
                             location,
                             containing_file);
  }
}